

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawListSplitter::Split(ImDrawListSplitter *this,ImDrawList *draw_list,int channels_count)

{
  ImVec4 *pIVar1;
  undefined8 *puVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  ImDrawChannel *pIVar6;
  void *pvVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  long lVar10;
  ImDrawChannel *__dest;
  long lVar11;
  void *pvVar12;
  long lVar13;
  void *__dest_00;
  long lVar14;
  char *__function;
  int iVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  
  if ((this->_Current != 0) || (1 < this->_Count)) {
    __assert_fail("_Current == 0 && _Count <= 1 && \"Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0x528,"void ImDrawListSplitter::Split(ImDrawList *, int)");
  }
  iVar4 = (this->_Channels).Size;
  if (iVar4 < channels_count) {
    iVar5 = (this->_Channels).Capacity;
    if (iVar5 < channels_count) {
      if (iVar5 == 0) {
        iVar15 = 8;
      }
      else {
        iVar15 = iVar5 / 2 + iVar5;
      }
      if (iVar15 <= channels_count) {
        iVar15 = channels_count;
      }
      if (iVar5 < iVar15) {
        __dest = (ImDrawChannel *)ImGui::MemAlloc((long)iVar15 << 5);
        pIVar6 = (this->_Channels).Data;
        if (pIVar6 != (ImDrawChannel *)0x0) {
          memcpy(__dest,pIVar6,(long)(this->_Channels).Size << 5);
          ImGui::MemFree((this->_Channels).Data);
        }
        (this->_Channels).Data = __dest;
        (this->_Channels).Capacity = iVar15;
      }
    }
    (this->_Channels).Size = channels_count;
  }
  this->_Count = channels_count;
  if ((this->_Channels).Size < 1) {
LAB_00150715:
    __assert_fail("i < Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                  ,0x52e,"T &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
  }
  pIVar6 = (this->_Channels).Data;
  (pIVar6->_IdxBuffer).Size = 0;
  (pIVar6->_IdxBuffer).Capacity = 0;
  (pIVar6->_IdxBuffer).Data = (uint *)0x0;
  (pIVar6->_CmdBuffer).Size = 0;
  (pIVar6->_CmdBuffer).Capacity = 0;
  (pIVar6->_CmdBuffer).Data = (ImDrawCmd *)0x0;
  if (1 < channels_count) {
    uVar18 = 1;
    lVar17 = 0x38;
    do {
      lVar11 = (long)(this->_Channels).Size;
      if ((long)uVar18 < (long)iVar4) {
        if (lVar11 <= (long)uVar18) goto LAB_00150715;
        pIVar6 = (this->_Channels).Data;
        iVar5 = *(int *)((long)pIVar6 + lVar17 + -0x14);
        if (iVar5 < 0) {
          uVar16 = iVar5 / 2 + iVar5;
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          pvVar12 = ImGui::MemAlloc((ulong)uVar16 * 0x38);
          pvVar7 = *(void **)((long)pIVar6 + lVar17 + -0x10);
          if (pvVar7 != (void *)0x0) {
            memcpy(pvVar12,pvVar7,(long)*(int *)((long)pIVar6 + lVar17 + -0x18) * 0x38);
            ImGui::MemFree(*(void **)((long)pIVar6 + lVar17 + -0x10));
          }
          *(void **)((long)pIVar6 + lVar17 + -0x10) = pvVar12;
          *(uint *)((long)pIVar6 + lVar17 + -0x14) = uVar16;
        }
        *(undefined4 *)((long)pIVar6 + lVar17 + -0x18) = 0;
        if ((long)(this->_Channels).Size <= (long)uVar18) goto LAB_00150715;
        pIVar6 = (this->_Channels).Data;
        iVar5 = *(int *)((long)pIVar6 + lVar17 + -4);
        if (iVar5 < 0) {
          uVar16 = iVar5 / 2 + iVar5;
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          pvVar12 = ImGui::MemAlloc((ulong)uVar16 * 4);
          pvVar7 = *(void **)((long)&(pIVar6->_CmdBuffer).Size + lVar17);
          if (pvVar7 != (void *)0x0) {
            memcpy(pvVar12,pvVar7,(long)*(int *)((long)pIVar6 + lVar17 + -8) << 2);
            ImGui::MemFree(*(void **)((long)&(pIVar6->_CmdBuffer).Size + lVar17));
          }
          *(void **)((long)&(pIVar6->_CmdBuffer).Size + lVar17) = pvVar12;
          *(uint *)((long)pIVar6 + lVar17 + -4) = uVar16;
        }
        *(undefined4 *)((long)pIVar6 + lVar17 + -8) = 0;
      }
      else {
        if (lVar11 <= (long)uVar18) goto LAB_00150715;
        pIVar6 = (this->_Channels).Data;
        puVar2 = (undefined8 *)((long)pIVar6 + lVar17 + -8);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)pIVar6 + lVar17 + -0x18);
        *puVar2 = 0;
        puVar2[1] = 0;
      }
      if ((long)(this->_Channels).Size <= (long)uVar18) goto LAB_00150715;
      pIVar6 = (this->_Channels).Data;
      if (*(int *)((long)pIVar6 + lVar17 + -0x18) == 0) {
        lVar11 = (long)(draw_list->_ClipRectStack).Size;
        if (lVar11 < 1) {
          __function = "T &ImVector<ImVec4>::back() [T = ImVec4]";
LAB_00150760:
          __assert_fail("Size > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                        ,0x538,__function);
        }
        pIVar1 = (draw_list->_ClipRectStack).Data + lVar11 + -1;
        lVar11._0_4_ = pIVar1->x;
        lVar11._4_4_ = pIVar1->y;
        uVar8 = pIVar1->z;
        uVar9 = pIVar1->w;
        lVar13 = (long)(draw_list->_TextureIdStack).Size;
        if (lVar13 < 1) {
          __function = "T &ImVector<void *>::back() [T = void *]";
          goto LAB_00150760;
        }
        pvVar7 = (draw_list->_TextureIdStack).Data[lVar13 + -1];
        if (*(int *)((long)pIVar6 + lVar17 + -0x14) == 0) {
          __dest_00 = ImGui::MemAlloc(0x1c0);
          pvVar12 = *(void **)((long)pIVar6 + lVar17 + -0x10);
          if (pvVar12 != (void *)0x0) {
            memcpy(__dest_00,pvVar12,(long)*(int *)((long)pIVar6 + lVar17 + -0x18) * 0x38);
            ImGui::MemFree(*(void **)((long)pIVar6 + lVar17 + -0x10));
          }
          *(void **)((long)pIVar6 + lVar17 + -0x10) = __dest_00;
          *(undefined4 *)((long)pIVar6 + lVar17 + -0x14) = 8;
        }
        lVar13 = *(long *)((long)pIVar6 + lVar17 + -0x10);
        lVar14 = (long)*(int *)((long)pIVar6 + lVar17 + -0x18) * 0x38;
        *(ulong *)(lVar13 + 0x10 + lVar14) = CONCAT44(uStack_34,uVar9);
        lVar10 = CONCAT44(uVar8,lVar11._4_4_);
        *(long *)(lVar13 + lVar14) = lVar11 << 0x20;
        ((long *)(lVar13 + lVar14))[1] = lVar10;
        *(void **)(lVar13 + 0x18 + lVar14) = pvVar7;
        puVar2 = (undefined8 *)(lVar13 + 0x20 + lVar14);
        *puVar2 = 0;
        puVar2[1] = 0;
        *(undefined8 *)(lVar13 + 0x30 + lVar14) = 0;
        piVar3 = (int *)((long)pIVar6 + lVar17 + -0x18);
        *piVar3 = *piVar3 + 1;
      }
      uVar18 = uVar18 + 1;
      lVar17 = lVar17 + 0x20;
    } while ((uint)channels_count != uVar18);
  }
  return;
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_ASSERT(_Current == 0 && _Count <= 1 && "Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.");
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
        if (_Channels[i]._CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            draw_cmd.ClipRect = draw_list->_ClipRectStack.back();
            draw_cmd.TextureId = draw_list->_TextureIdStack.back();
            _Channels[i]._CmdBuffer.push_back(draw_cmd);
        }
    }
}